

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O3

vector<unsigned_long,_std::allocator<unsigned_long>_> *
mxx::all2all<unsigned_long>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          unsigned_long *msgs,size_t size,comm *comm)

{
  allocator_type local_21;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,(long)comm->m_size * size,&local_21);
  all2all<unsigned_long>
            (msgs,size,
             (__return_storage_ptr__->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start,comm);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> all2all(const T* msgs, size_t size, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result(size*comm.size());
    all2all(msgs, size, &result[0], comm);
    return result;
}